

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1fd0be::BuildEngineImpl::attachDB
          (BuildEngineImpl *this,
          unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> *database
          ,string *error_out)

{
  bool bVar1;
  int iVar2;
  pointer pBVar3;
  undefined4 extraout_var;
  byte local_21;
  string *psStack_20;
  bool success;
  string *error_out_local;
  unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> *database_local;
  BuildEngineImpl *this_local;
  
  psStack_20 = error_out;
  error_out_local = (string *)database;
  database_local =
       (unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->db);
  if (bVar1) {
    __assert_fail("!db && \"invalid attachDB() call\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x68b,
                  "bool (anonymous namespace)::BuildEngineImpl::attachDB(std::unique_ptr<BuildDB>, std::string *)"
                 );
  }
  if (this->currentEpoch != 0) {
    __assert_fail("currentEpoch == 0 && \"invalid attachDB() call\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x68c,
                  "bool (anonymous namespace)::BuildEngineImpl::attachDB(std::unique_ptr<BuildDB>, std::string *)"
                 );
  }
  bVar1 = std::
          unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
          ::empty(&this->ruleInfos);
  if (!bVar1) {
    __assert_fail("ruleInfos.empty() && \"invalid attachDB() call\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x68d,
                  "bool (anonymous namespace)::BuildEngineImpl::attachDB(std::unique_ptr<BuildDB>, std::string *)"
                 );
  }
  std::unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::operator=
            (&this->db,database);
  pBVar3 = std::unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::
           operator->(&this->db);
  (*pBVar3->_vptr_BuildDB[2])(pBVar3,this);
  pBVar3 = std::unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::
           operator->(&this->db);
  iVar2 = (*pBVar3->_vptr_BuildDB[3])(pBVar3,&local_21,psStack_20);
  this->currentEpoch = CONCAT44(extraout_var,iVar2);
  return (bool)(local_21 & 1);
}

Assistant:

bool attachDB(std::unique_ptr<BuildDB> database, std::string* error_out) {
    assert(!db && "invalid attachDB() call");
    assert(currentEpoch == 0 && "invalid attachDB() call");
    assert(ruleInfos.empty() && "invalid attachDB() call");
    db = std::move(database);
    db->attachDelegate(this);

    // Load our initial state from the database.
    bool success;
    currentEpoch = db->getCurrentEpoch(&success, error_out);
    return success;
  }